

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBuffer.c
# Opt level: O1

Abc_Ntk_t * Abc_SclUnBufferPerform(Abc_Ntk_t *pNtk,int fVerbose)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  void *pvVar3;
  Abc_Obj_t *pObj;
  void **ppvVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int *__ptr;
  void *__s;
  Vec_Ptr_t *pVVar8;
  Abc_Obj_t *pFanin;
  Abc_Ntk_t *pAVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  
  iVar1 = pNtk->vObjs->nSize;
  __ptr = (int *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  __ptr[1] = 0;
  *__ptr = iVar6;
  if (iVar6 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar6 << 2);
  }
  *(void **)(__ptr + 2) = __s;
  __ptr[1] = iVar1;
  memset(__s,0xff,(long)iVar1 * 4);
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar8->pArray[lVar11];
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        iVar6 = Abc_SclIsInv(pAVar2);
        if (iVar6 != 0) {
          iVar6 = *(pAVar2->vFanins).pArray;
          pvVar3 = pAVar2->pNtk->vObjs->pArray[iVar6];
          if (((*(uint *)((long)pvVar3 + 0x14) & 0xf) != 7) || (*(int *)((long)pvVar3 + 0x1c) != 1))
          {
            if ((iVar6 < 0) || (iVar1 <= iVar6)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)((long)__s + (long)iVar6 * 4) = pAVar2->Id;
          }
        }
      }
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar11 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      pAVar2 = (Abc_Obj_t *)pVVar8->pArray[lVar11];
      if (((pAVar2 != (Abc_Obj_t *)0x0) && (uVar7 = *(uint *)&pAVar2->field_0x14 & 0xf, uVar7 < 8))
         && ((0x98U >> uVar7 & 1) != 0)) {
        if (iVar1 <= lVar11) break;
        if (0 < (pAVar2->vFanins).nSize) {
          lVar12 = 0;
          do {
            pObj = (Abc_Obj_t *)pAVar2->pNtk->vObjs->pArray[(pAVar2->vFanins).pArray[lVar12]];
            if (((*(uint *)&pObj->field_0x14 & 0xf) == 7) && ((pObj->vFanins).nSize == 1)) {
              uVar7 = Abc_SclGetRealFaninLit(pObj);
              uVar10 = uVar7 >> 1;
              iVar6 = pNtk->vObjs->nSize;
              if (iVar6 <= (int)uVar10) {
LAB_003d8fca:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              ppvVar4 = pNtk->vObjs->pArray;
              uVar13 = (ulong)uVar10;
              pFanin = (Abc_Obj_t *)ppvVar4[uVar13];
              if ((uVar7 & 1) != 0) {
                if (__ptr[1] <= (int)uVar10) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                lVar5 = *(long *)(__ptr + 2);
                uVar7 = *(uint *)(lVar5 + uVar13 * 4);
                if ((ulong)uVar7 == 0xffffffff) {
                  pFanin = Abc_NtkCreateNodeInv(pNtk,pFanin);
                  *(int *)(lVar5 + uVar13 * 4) = pFanin->Id;
                }
                else {
                  if (((int)uVar7 < 0) || (iVar6 <= (int)uVar7)) goto LAB_003d8fca;
                  pFanin = (Abc_Obj_t *)ppvVar4[uVar7];
                }
                if ((pFanin->vFanins).nSize != 1) {
                  __assert_fail("Abc_ObjFaninNum(pFaninNew) == 1",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/scl/sclBuffer.c"
                                ,0x9f,"Abc_Ntk_t *Abc_SclUnBufferPerform(Abc_Ntk_t *, int)");
                }
              }
              if (pObj != pFanin) {
                Abc_ObjPatchFanin(pAVar2,pObj,pFanin);
              }
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < (pAVar2->vFanins).nSize);
        }
      }
      lVar11 = lVar11 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar11 < pVVar8->nSize);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
    __ptr[2] = 0;
    __ptr[3] = 0;
  }
  free(__ptr);
  pAVar9 = Abc_NtkDupDfs(pNtk);
  return pAVar9;
}

Assistant:

Abc_Ntk_t * Abc_SclUnBufferPerform( Abc_Ntk_t * pNtk, int fVerbose )
{
    Vec_Int_t * vLits;
    Abc_Obj_t * pObj, * pFanin, * pFaninNew;
    int i, k, iLit, nNodesOld = Abc_NtkObjNumMax(pNtk);
    // assign inverters
    vLits = Vec_IntStartFull( Abc_NtkObjNumMax(pNtk) );
    Abc_NtkForEachNode( pNtk, pObj, i )
        if ( Abc_SclIsInv(pObj) && !Abc_SclObjIsBufInv(Abc_ObjFanin0(pObj)) )
            Vec_IntWriteEntry( vLits, Abc_ObjFaninId0(pObj), Abc_ObjId(pObj) );
    // transfer fanins
    Abc_NtkForEachNodeCo( pNtk, pObj, i )
    {
        if ( i >= nNodesOld )
            break;
        Abc_ObjForEachFanin( pObj, pFanin, k )
        {
            if ( !Abc_SclObjIsBufInv(pFanin) )
                continue;
            iLit = Abc_SclGetRealFaninLit( pFanin );
            pFaninNew = Abc_NtkObj( pNtk, Abc_Lit2Var(iLit) );
            if ( Abc_LitIsCompl(iLit) )
            {
                if ( Vec_IntEntry( vLits, Abc_Lit2Var(iLit) ) == -1 )
                {
                    pFaninNew = Abc_NtkCreateNodeInv( pNtk, pFaninNew );
                    Vec_IntWriteEntry( vLits, Abc_Lit2Var(iLit), Abc_ObjId(pFaninNew) );
                }
                else
                    pFaninNew = Abc_NtkObj( pNtk, Vec_IntEntry( vLits, Abc_Lit2Var(iLit) ) );
                assert( Abc_ObjFaninNum(pFaninNew) == 1 );
            }
            if ( pFanin != pFaninNew )
                Abc_ObjPatchFanin( pObj, pFanin, pFaninNew );
        }
    }
    Vec_IntFree( vLits );
    // duplicate network in topo order
    return Abc_NtkDupDfs( pNtk );
}